

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int k;
  int iVar21;
  long lVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 in_XMM2_Qb;
  int local_8c;
  
  if (0 < partitionCount) {
    uVar17 = 0;
    do {
      iVar2 = this->kPartialsPaddedStateCount;
      iVar3 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar17]];
      iVar4 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar17] + 1];
      lVar22 = (long)iVar4;
      pfVar7 = this->gPartials[bufferIndices[uVar17]];
      pfVar8 = this->gCategoryWeights[categoryWeightsIndices[uVar17]];
      uVar5 = cumulativeScaleIndices[uVar17];
      iVar6 = this->kStateCount;
      pfVar9 = this->gStateFrequencies[stateFrequenciesIndices[uVar17]];
      local_8c = iVar6 * iVar3;
      iVar14 = iVar2 * iVar3;
      if (iVar3 < iVar4) {
        pfVar10 = this->integrationTmp;
        iVar19 = local_8c;
        iVar18 = iVar3;
        do {
          if (0 < iVar6) {
            lVar13 = 0;
            iVar21 = 0;
            do {
              iVar21 = iVar21 + -1;
              *(float *)((long)pfVar10 + lVar13 + (long)iVar19 * 4) =
                   *(float *)((long)pfVar7 + lVar13 + (long)iVar14 * 4) * *pfVar8;
              lVar13 = lVar13 + 4;
            } while (-iVar6 != iVar21);
            iVar19 = iVar19 - iVar21;
            iVar14 = iVar14 - iVar21;
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar4);
      }
      iVar19 = this->kCategoryCount;
      if (1 < (long)iVar19) {
        lVar13 = 1;
        iVar18 = this->kPatternCount;
        do {
          iVar14 = iVar14 + ((iVar3 - iVar4) + iVar18) * iVar2;
          if (iVar3 < iVar4) {
            pfVar10 = this->integrationTmp;
            iVar21 = iVar3;
            iVar20 = local_8c;
            do {
              if (0 < iVar6) {
                iVar15 = 0;
                lVar16 = 0;
                do {
                  iVar15 = iVar15 + -1;
                  auVar24 = vfmadd213ss_fma(ZEXT416((uint)pfVar8[lVar13]),
                                            ZEXT416(*(uint *)((long)pfVar7 +
                                                             lVar16 + (long)iVar14 * 4)),
                                            ZEXT416(*(uint *)((long)pfVar10 +
                                                             lVar16 + (long)iVar20 * 4)));
                  *(int *)((long)pfVar10 + lVar16 + (long)iVar20 * 4) = auVar24._0_4_;
                  lVar16 = lVar16 + 4;
                } while (-iVar6 != iVar15);
                iVar20 = iVar20 - iVar15;
                iVar14 = iVar14 - iVar15;
              }
              iVar21 = iVar21 + 1;
            } while (iVar21 != iVar4);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != iVar19);
      }
      if (iVar3 < iVar4) {
        lVar16 = (long)iVar3;
        lVar13 = lVar16;
        do {
          iVar2 = this->kStateCount;
          if ((long)iVar2 < 1) {
            dVar23 = 0.0;
          }
          else {
            auVar24 = ZEXT816(0);
            lVar12 = 0;
            do {
              auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)pfVar9[lVar12]),
                                        ZEXT416((uint)this->integrationTmp[local_8c + lVar12]));
              lVar12 = lVar12 + 1;
            } while (iVar2 != lVar12);
            dVar23 = (double)auVar24._0_4_;
            local_8c = local_8c + iVar2;
          }
          dVar23 = log(dVar23);
          this->outLogLikelihoodsTmp[lVar13] = (float)dVar23;
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar22);
        if (-1 < (int)uVar5) {
          if (iVar4 <= iVar3) goto LAB_0013bf18;
          pfVar7 = this->gScaleBuffers[uVar5];
          pfVar8 = this->outLogLikelihoodsTmp;
          lVar13 = lVar16;
          do {
            pfVar8[lVar13] = pfVar7[lVar13] + pfVar8[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar22 != lVar13);
        }
        outSumLogLikelihoodByPartition[uVar17] = 0.0;
        if (iVar3 < iVar4) {
          pdVar11 = this->gPatternWeights;
          pfVar7 = this->outLogLikelihoodsTmp;
          auVar24 = ZEXT816(0) << 0x40;
          do {
            auVar25._0_8_ = (double)pfVar7[lVar16];
            auVar25._8_8_ = in_XMM2_Qb;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = pdVar11[lVar16];
            auVar24 = vfmadd231sd_fma(auVar24,auVar25,auVar1);
            lVar16 = lVar16 + 1;
            outSumLogLikelihoodByPartition[uVar17] = auVar24._0_8_;
          } while (lVar22 != lVar16);
        }
      }
      else {
LAB_0013bf18:
        outSumLogLikelihoodByPartition[uVar17] = 0.0;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                         const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* cumulativeScaleIndices,
                                                         const int* partitionIndices,
                                                         int partitionCount,
                                                         double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[p]];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];
        int u = startPattern * kStateCount;
        int v = startPattern * kPartialsPaddedStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = startPattern * kStateCount;
            v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            for (int k = startPattern; k < endPattern; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = startPattern * kStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sum);
        }

        if (scalingFactorsIndex >= 0) {
            const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
            for(int i=startPattern; i<endPattern; i++) {
                outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
            }
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }

}